

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void InitMarshalData(SstStream Stream)

{
  FMFieldList *FieldP;
  int *CountP;
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)malloc(0x78);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  FieldP = (FMFieldList *)(puVar1 + 4);
  Stream->WriterMarshalData = puVar1;
  *(undefined4 *)puVar1 = 0;
  pvVar2 = malloc(0x28);
  puVar1[1] = pvVar2;
  CountP = (int *)(puVar1 + 3);
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 6) = 0;
  puVar1[7] = 0;
  uVar3 = create_local_FMcontext();
  puVar1[2] = uVar3;
  AddSimpleField(FieldP,CountP,"BitFieldCount","integer",8);
  AddSimpleField(FieldP,CountP,"BitField","integer[BitFieldCount]",8);
  AddSimpleField(FieldP,CountP,"DataBlockSize","integer",8);
  RecalcMarshalStorageSize(Stream);
  puVar1 = (undefined8 *)Stream->M;
  *puVar1 = 0;
  pvVar2 = malloc(8);
  puVar1[1] = pvVar2;
  puVar1[2] = 0;
  return;
}

Assistant:

static void InitMarshalData(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = malloc(sizeof(struct FFSWriterMarshalBase));
    struct FFSMetadataInfoStruct *MBase;

    memset(Info, 0, sizeof(*Info));
    Stream->WriterMarshalData = Info;
    Info->RecCount = 0;
    Info->RecList = malloc(sizeof(Info->RecList[0]));
    Info->MetaFieldCount = 0;
    Info->MetaFields = NULL;
    Info->DataFieldCount = 0;
    Info->DataFields = NULL;
    Info->LocalFMContext = create_local_FMcontext();
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitFieldCount", "integer",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitField", "integer[BitFieldCount]",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "DataBlockSize", "integer",
                   sizeof(size_t));
    RecalcMarshalStorageSize(Stream);
    MBase = Stream->M;
    MBase->BitFieldCount = 0;
    MBase->BitField = malloc(sizeof(size_t));
    MBase->DataBlockSize = 0;
}